

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::AddNodeToGraph
          (Discreet3DSImporter *this,aiScene *pcSOut,aiNode *pcOut,Node *pcIn,aiMatrix4x4 *param_4)

{
  string *__lhs;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *this_00;
  aiVector3t<float> *paVar1;
  undefined8 *puVar2;
  aiQuaternion *paVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  aiColor4D *paVar9;
  aiMesh *paVar10;
  pointer paVar11;
  aiAnimation *paVar12;
  pointer paVar13;
  aiCamera *paVar14;
  aiLight *paVar15;
  pointer ppNVar16;
  pointer ppNVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  __type _Var23;
  bool bVar24;
  iterator it;
  uint *puVar25;
  aiVector3t<float> *paVar26;
  Logger *pLVar27;
  pointer paVar28;
  pointer paVar29;
  aiNodeAnim *paVar30;
  aiVectorKey *paVar31;
  aiQuatKey *paVar32;
  aiQuaterniont<float> *paVar33;
  aiNode **ppaVar34;
  aiNode *this_01;
  ulong uVar35;
  aiVector3D *paVar36;
  pointer paVar37;
  pointer paVar38;
  aiQuatKey *paVar39;
  uint n;
  pointer puVar40;
  ulong uVar41;
  long lVar42;
  uint n_2;
  pointer puVar43;
  uint uVar44;
  aiVector3t<float> aVar45;
  aiQuaterniont<float> aVar46;
  aiVector3D pivot;
  aiMatrix4x4 mInvTransposed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> iArray;
  aiMatrix4x4 mInv;
  
  iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&iArray,3);
  __lhs = &pcIn->mName;
  fVar4 = 0.0;
  while( true ) {
    mInv.a1 = fVar4;
    if (pcSOut->mNumMeshes <= (uint)fVar4) break;
    paVar9 = pcSOut->mMeshes[(uint)fVar4]->mColors[0];
    if (paVar9 == (aiColor4D *)0x0) {
      __assert_fail("__null != pcMesh",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/3DS/3DSConverter.cpp"
                    ,0x1cb,
                    "void Assimp::Discreet3DSImporter::AddNodeToGraph(aiScene *, aiNode *, D3DS::Node *, aiMatrix4x4 &)"
                   );
    }
    _Var23 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&paVar9[4].b);
    if (_Var23) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&iArray,(value_type_conflict4 *)&mInv);
    }
    fVar4 = (float)((int)mInv.a1 + 1);
  }
  if (iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar9 = pcSOut->mMeshes
             [*iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start]->mColors[0];
    mInv.a1 = paVar9[9].b;
    mInv.a2 = paVar9[9].a;
    uVar18 = paVar9[10].r;
    uVar19 = paVar9[10].g;
    uVar20 = paVar9[10].b;
    uVar21 = paVar9[10].a;
    mInv.b3 = paVar9[0xb].r;
    mInv.b4 = paVar9[0xb].g;
    mInv.c1 = paVar9[0xb].b;
    mInv.c2 = paVar9[0xb].a;
    mInv.c3 = paVar9[0xc].r;
    mInv.c4 = paVar9[0xc].g;
    mInv.d1 = paVar9[0xc].b;
    mInv.d2 = paVar9[0xc].a;
    mInv.d3 = paVar9[0xd].r;
    mInv.d4 = paVar9[0xd].g;
    mInvTransposed.a1 = paVar9[9].b;
    mInvTransposed.a2 = paVar9[9].a;
    mInvTransposed.a3 = paVar9[10].r;
    mInvTransposed.a4 = paVar9[10].g;
    mInvTransposed.b1 = paVar9[10].b;
    mInvTransposed.b2 = paVar9[10].a;
    mInvTransposed.b3 = paVar9[0xb].r;
    mInvTransposed.b4 = paVar9[0xb].g;
    mInvTransposed.c1 = paVar9[0xb].b;
    mInvTransposed.c2 = paVar9[0xb].a;
    mInvTransposed.c3 = paVar9[0xc].r;
    mInvTransposed.c4 = paVar9[0xc].g;
    mInvTransposed.d1 = paVar9[0xc].b;
    mInvTransposed.d2 = paVar9[0xc].a;
    mInvTransposed.d3 = paVar9[0xd].r;
    mInvTransposed.d4 = paVar9[0xd].g;
    mInv.a3 = (float)uVar18;
    mInv.a4 = (float)uVar19;
    mInv.b1 = (float)uVar20;
    mInv.b2 = (float)uVar21;
    aiMatrix4x4t<float>::Inverse(&mInv);
    puVar43 = iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    puVar40 = iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    fVar4 = mInvTransposed.b1;
    mInvTransposed.b1 = mInvTransposed.a2;
    mInvTransposed.a2 = fVar4;
    fVar5 = mInvTransposed.c1;
    fVar6 = mInvTransposed.c2;
    fVar4 = mInvTransposed.a4;
    mInvTransposed.c2 = mInvTransposed.b3;
    mInvTransposed.c1 = mInvTransposed.a3;
    fVar7 = mInvTransposed.d2;
    mInvTransposed.a4 = mInvTransposed.d1;
    mInvTransposed.a3 = fVar5;
    mInvTransposed.d2 = mInvTransposed.b4;
    mInvTransposed.d1 = fVar4;
    mInvTransposed.b4 = fVar7;
    mInvTransposed.b3 = fVar6;
    fVar4 = mInvTransposed.d3;
    mInvTransposed.d3 = mInvTransposed.c4;
    mInvTransposed.c4 = fVar4;
    pivot.z = (pcIn->vPivot).z;
    pivot.x = (pcIn->vPivot).x;
    pivot.y = (pcIn->vPivot).y;
    uVar35 = (long)iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    pcOut->mNumMeshes = (uint)uVar35;
    puVar25 = (uint *)operator_new__(-(ulong)(uVar35 >> 0x3e != 0) |
                                     (long)iArray.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)iArray.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
    pcOut->mMeshes = puVar25;
    for (uVar44 = 0; uVar35 = (ulong)uVar44, uVar35 < (ulong)((long)puVar43 - (long)puVar40 >> 2);
        uVar44 = uVar44 + 1) {
      uVar8 = puVar40[uVar35];
      paVar10 = pcSOut->mMeshes[uVar8];
      if (paVar10->mColors[1] == (aiColor4D *)0x0) {
        paVar26 = paVar10->mVertices;
        paVar1 = paVar26 + paVar10->mNumVertices;
        paVar36 = paVar10->mNormals;
        for (lVar42 = (ulong)paVar10->mNumVertices * 0xc; lVar42 != 0; lVar42 = lVar42 + -0xc) {
          aVar45 = ::operator*(&mInv,paVar26);
          paVar26->x = (float)(int)aVar45._0_8_;
          paVar26->y = (float)(int)((ulong)aVar45._0_8_ >> 0x20);
          paVar26->z = aVar45.z;
          aVar45 = ::operator*(&mInvTransposed,paVar36);
          paVar36->x = (float)(int)aVar45._0_8_;
          paVar36->y = (float)(int)((ulong)aVar45._0_8_ >> 0x20);
          paVar36->z = aVar45.z;
          paVar26 = paVar26 + 1;
          paVar36 = paVar36 + 1;
        }
        fVar4 = aiMatrix4x4t<float>::Determinant((aiMatrix4x4t<float> *)&paVar9[9].b);
        if (fVar4 < 0.0) {
          paVar36 = paVar10->mNormals;
          for (paVar26 = paVar10->mVertices; paVar26 != paVar1; paVar26 = paVar26 + 1) {
            paVar26->x = -paVar26->x;
            paVar36->x = -paVar36->x;
            paVar36 = paVar36 + 1;
          }
          pLVar27 = DefaultLogger::get();
          Logger::info(pLVar27,"3DS: Flipping mesh X-Axis");
        }
        if ((pivot.x == 0.0) && (!NAN(pivot.x))) {
          if ((pivot.y == 0.0) && (((!NAN(pivot.y) && (pivot.z == 0.0)) && (!NAN(pivot.z)))))
          goto LAB_005f822f;
        }
        for (paVar26 = paVar10->mVertices; paVar26 != paVar1; paVar26 = paVar26 + 1) {
          aiVector3t<float>::operator-=(paVar26,&pivot);
        }
      }
LAB_005f822f:
      paVar10->mColors[1] = (aiColor4D *)0x1;
      pcOut->mMeshes[uVar35] = uVar8;
      puVar40 = iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar43 = iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  if (pcIn->mInstanceNumber < 2) {
    uVar35 = (pcIn->mName)._M_string_length;
    if (uVar35 < 0x400) {
      (pcOut->mName).length = (ai_uint32)uVar35;
      memcpy((pcOut->mName).data,(__lhs->_M_dataplus)._M_p,uVar35);
      (pcOut->mName).data[uVar35] = '\0';
    }
  }
  else {
    ASSIMP_itoa10<12ul>((char (*) [12])&mInvTransposed,pcIn->mInstanceNumber);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mInv,__lhs,
                   "_inst_");
    std::__cxx11::string::append((char *)&mInv);
    uVar35 = CONCAT44(mInv.a4,mInv.a3);
    if (uVar35 < 0x400) {
      (pcOut->mName).length = (ai_uint32)mInv.a3;
      memcpy((pcOut->mName).data,(void *)mInv._0_8_,uVar35);
      (pcOut->mName).data[uVar35] = '\0';
    }
    std::__cxx11::string::~string((string *)&mInv);
  }
  this_00 = &pcIn->aRotationKeys;
  paVar28 = (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_start;
  paVar37 = (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (paVar37 == paVar28) {
    paVar13 = (pcIn->aCameraRollKeys).
              super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pcIn->aCameraRollKeys).
        super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>.
        _M_impl.super__Vector_impl_data._M_finish != paVar13) {
      aiMatrix4x4t<float>::RotationZ(paVar13->mValue * -0.017453292,&pcOut->mTransformation);
    }
  }
  else {
    for (; paVar28 != paVar37; paVar28 = paVar28 + 1) {
      (paVar28->mValue).w = -(paVar28->mValue).w;
      paVar37 = (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    aiQuaterniont<float>::GetMatrix
              ((aiMatrix3x3t<float> *)&mInv,
               &((this_00->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
                 super__Vector_impl_data._M_start)->mValue);
    (pcOut->mTransformation).a1 = mInv.a1;
    (pcOut->mTransformation).a2 = mInv.a2;
    (pcOut->mTransformation).a3 = mInv.a3;
    (pcOut->mTransformation).a4 = 0.0;
    (pcOut->mTransformation).b1 = mInv.a4;
    (pcOut->mTransformation).b2 = mInv.b1;
    (pcOut->mTransformation).b3 = mInv.b2;
    (pcOut->mTransformation).b4 = 0.0;
    (pcOut->mTransformation).c1 = mInv.b3;
    (pcOut->mTransformation).c2 = mInv.b4;
    (pcOut->mTransformation).c3 = mInv.c1;
    (pcOut->mTransformation).c4 = 0.0;
    (pcOut->mTransformation).d1 = 0.0;
    (pcOut->mTransformation).d2 = 0.0;
    (pcOut->mTransformation).d3 = 0.0;
    (pcOut->mTransformation).d4 = 1.0;
  }
  paVar11 = (pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar11) {
    (pcOut->mTransformation).a1 = (paVar11->mValue).x * (pcOut->mTransformation).a1;
    (pcOut->mTransformation).b1 = (paVar11->mValue).x * (pcOut->mTransformation).b1;
    (pcOut->mTransformation).c1 = (paVar11->mValue).x * (pcOut->mTransformation).c1;
    (pcOut->mTransformation).a2 = (paVar11->mValue).y * (pcOut->mTransformation).a2;
    (pcOut->mTransformation).b2 = (paVar11->mValue).y * (pcOut->mTransformation).b2;
    (pcOut->mTransformation).c2 = (paVar11->mValue).y * (pcOut->mTransformation).c2;
    (pcOut->mTransformation).a3 = (paVar11->mValue).z * (pcOut->mTransformation).a3;
    (pcOut->mTransformation).b3 = (paVar11->mValue).z * (pcOut->mTransformation).b3;
    (pcOut->mTransformation).c3 = (paVar11->mValue).z * (pcOut->mTransformation).c3;
  }
  paVar11 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_start;
  paVar29 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  paVar38 = paVar29;
  if (paVar29 != paVar11) {
    (pcOut->mTransformation).a4 = (paVar11->mValue).x + (pcOut->mTransformation).a4;
    (pcOut->mTransformation).b4 = (paVar11->mValue).y + (pcOut->mTransformation).b4;
    (pcOut->mTransformation).c4 = (paVar11->mValue).z + (pcOut->mTransformation).c4;
    paVar38 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    paVar29 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (((1 < (ulong)(((long)paVar29 - (long)paVar38) / 0x18)) ||
      (1 < (ulong)(((long)(pcIn->aRotationKeys).
                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pcIn->aRotationKeys).
                         super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x18))) ||
     ((1 < (ulong)(((long)(pcIn->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pcIn->aScalingKeys).
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x18) ||
      ((0x10 < (ulong)((long)(pcIn->aCameraRollKeys).
                             super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pcIn->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_start) ||
       (1 < (ulong)(((long)(pcIn->aTargetPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pcIn->aTargetPositionKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18))))))) {
    paVar12 = *pcSOut->mAnimations;
    if (paVar12 == (aiAnimation *)0x0) {
      __assert_fail("nullptr != anim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/3DS/3DSConverter.cpp"
                    ,0x242,
                    "void Assimp::Discreet3DSImporter::AddNodeToGraph(aiScene *, aiNode *, D3DS::Node *, aiMatrix4x4 &)"
                   );
    }
    if (0x10 < (ulong)((long)(pcIn->aCameraRollKeys).
                             super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pcIn->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pLVar27 = DefaultLogger::get();
      Logger::debug(pLVar27,"3DS: Converting camera roll track ...");
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::resize
                (this_00,(long)(pcIn->aCameraRollKeys).
                               super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pcIn->aCameraRollKeys).
                               super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar44 = 0;
      while( true ) {
        uVar35 = (ulong)uVar44;
        paVar13 = (pcIn->aCameraRollKeys).
                  super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pcIn->aCameraRollKeys).
                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 4) <= uVar35
           ) break;
        paVar28 = (this_00->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        paVar28[uVar35].mTime = paVar13[uVar35].mTime;
        aiQuaterniont<float>::aiQuaterniont
                  ((aiQuaterniont<float> *)&mInv,0.0,0.0,paVar13[uVar35].mValue * 0.017453292);
        paVar3 = &paVar28[uVar35].mValue;
        paVar3->w = mInv.a1;
        paVar3->x = mInv.a2;
        paVar3->y = mInv.a3;
        paVar3->z = mInv.a4;
        uVar44 = uVar44 + 1;
      }
    }
    for (uVar35 = 0; uVar35 < pcSOut->mNumCameras; uVar35 = uVar35 + 1) {
      bVar24 = aiString::operator==(&pcSOut->mCameras[uVar35]->mName,&pcOut->mName);
      if (bVar24) {
        paVar14 = pcSOut->mCameras[uVar35];
        (paVar14->mLookAt).x = 0.0;
        (paVar14->mLookAt).y = 0.0;
        (paVar14->mLookAt).z = 1.0;
      }
    }
    for (uVar35 = 0; uVar35 < pcSOut->mNumLights; uVar35 = uVar35 + 1) {
      bVar24 = aiString::operator==(&pcSOut->mLights[uVar35]->mName,&pcOut->mName);
      if (bVar24) {
        paVar15 = pcSOut->mLights[uVar35];
        (paVar15->mDirection).x = 0.0;
        (paVar15->mDirection).y = 0.0;
        (paVar15->mDirection).z = 1.0;
      }
    }
    paVar30 = (aiNodeAnim *)operator_new(0x438);
    (paVar30->mNodeName).length = 0;
    (paVar30->mNodeName).data[0] = '\0';
    memset((paVar30->mNodeName).data + 1,0x1b,0x3ff);
    paVar30->mRotationKeys = (aiQuatKey *)0x0;
    paVar30->mNumScalingKeys = 0;
    *(undefined8 *)&paVar30->mNumPositionKeys = 0;
    *(undefined8 *)((long)&paVar30->mPositionKeys + 4) = 0;
    paVar30->mScalingKeys = (aiVectorKey *)0x0;
    paVar30->mPreState = aiAnimBehaviour_DEFAULT;
    paVar30->mPostState = aiAnimBehaviour_DEFAULT;
    uVar44 = paVar12->mNumChannels;
    paVar12->mNumChannels = uVar44 + 1;
    paVar12->mChannels[uVar44] = paVar30;
    uVar35 = (pcIn->mName)._M_string_length;
    if (uVar35 < 0x400) {
      (paVar30->mNodeName).length = (ai_uint32)uVar35;
      memcpy((paVar30->mNodeName).data,(__lhs->_M_dataplus)._M_p,uVar35);
      (paVar30->mNodeName).data[uVar35] = '\0';
    }
    paVar11 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar42 = (long)(pcIn->aPositionKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)paVar11;
    if (lVar42 != 0) {
      uVar35 = lVar42 / 0x18;
      paVar30->mNumPositionKeys = (uint)uVar35;
      uVar35 = uVar35 & 0xffffffff;
      uVar41 = uVar35 * 0x18;
      paVar31 = (aiVectorKey *)operator_new__(uVar41);
      if (uVar35 != 0) {
        lVar42 = 0;
        do {
          *(undefined4 *)((long)&(paVar31->mValue).z + lVar42) = 0;
          puVar2 = (undefined8 *)((long)&paVar31->mTime + lVar42);
          *puVar2 = 0;
          puVar2[1] = 0;
          lVar42 = lVar42 + 0x18;
        } while (uVar41 - lVar42 != 0);
      }
      paVar30->mPositionKeys = paVar31;
      memcpy(paVar31,paVar11,uVar41);
    }
    lVar42 = (long)(pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar42 != 0) {
      uVar35 = lVar42 / 0x18;
      paVar30->mNumRotationKeys = (uint)uVar35;
      uVar41 = uVar35 & 0xffffffff;
      paVar32 = (aiQuatKey *)operator_new__(uVar41 * 0x18);
      if (uVar41 != 0) {
        paVar39 = paVar32;
        do {
          paVar39->mTime = 0.0;
          (paVar39->mValue).w = 1.0;
          (paVar39->mValue).x = 0.0;
          (paVar39->mValue).y = 0.0;
          (paVar39->mValue).z = 0.0;
          paVar39 = paVar39 + 1;
        } while (paVar39 != paVar32 + uVar41);
      }
      paVar30->mRotationKeys = paVar32;
      mInv.a1 = 1.0;
      mInv.a2 = 0.0;
      mInv.a3 = 0.0;
      mInv.a4 = 0.0;
      lVar42 = 8;
      for (uVar41 = 0; uVar41 < (uVar35 & 0xffffffff); uVar41 = uVar41 + 1) {
        paVar28 = (this_00->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        paVar33 = (aiQuaterniont<float> *)((long)&paVar28->mTime + lVar42);
        if (lVar42 == 8) {
          fVar4 = (paVar28->mValue).w;
          fVar6 = (paVar28->mValue).x;
          fVar5 = (paVar28->mValue).y;
          fVar7 = (paVar28->mValue).z;
        }
        else {
          aVar46 = aiQuaterniont<float>::operator*((aiQuaterniont<float> *)&mInv,paVar33);
          fVar5 = aVar46.y;
          fVar7 = aVar46.z;
          fVar4 = aVar46.w;
          fVar6 = aVar46.x;
        }
        mInv.a2 = fVar6;
        mInv.a1 = fVar4;
        *(undefined8 *)((long)paVar30->mRotationKeys + lVar42 + -8) = *(undefined8 *)&paVar33[-1].y;
        mInv.a3 = fVar5;
        mInv.a4 = fVar7;
        paVar33 = aiQuaterniont<float>::Normalize((aiQuaterniont<float> *)&mInv);
        uVar22 = *(undefined8 *)&paVar33->y;
        puVar2 = (undefined8 *)((long)&paVar30->mRotationKeys->mTime + lVar42);
        *puVar2 = *(undefined8 *)paVar33;
        puVar2[1] = uVar22;
        uVar35 = (ulong)paVar30->mNumRotationKeys;
        lVar42 = lVar42 + 0x18;
      }
    }
    paVar11 = (pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar42 = (long)(pcIn->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)paVar11;
    if (lVar42 != 0) {
      uVar35 = lVar42 / 0x18;
      paVar30->mNumScalingKeys = (uint)uVar35;
      uVar35 = uVar35 & 0xffffffff;
      uVar41 = uVar35 * 0x18;
      paVar31 = (aiVectorKey *)operator_new__(uVar41);
      if (uVar35 != 0) {
        lVar42 = 0;
        do {
          *(undefined4 *)((long)&(paVar31->mValue).z + lVar42) = 0;
          puVar2 = (undefined8 *)((long)&paVar31->mTime + lVar42);
          *puVar2 = 0;
          puVar2[1] = 0;
          lVar42 = lVar42 + 0x18;
        } while (uVar41 - lVar42 != 0);
      }
      paVar30->mScalingKeys = paVar31;
      memcpy(paVar31,paVar11,uVar41);
    }
  }
  pcOut->mNumChildren =
       (uint)((ulong)((long)(pcIn->mChildren).
                            super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pcIn->mChildren).
                           super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar41 = (long)(pcIn->mChildren).
                 super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pcIn->mChildren).
                 super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  uVar35 = 0xffffffffffffffff;
  if (-1 < (long)uVar41) {
    uVar35 = uVar41;
  }
  ppaVar34 = (aiNode **)operator_new__(uVar35);
  pcOut->mChildren = ppaVar34;
  ppNVar16 = (pcIn->mChildren).
             super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  ppNVar17 = (pcIn->mChildren).
             super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  for (uVar35 = 0; ((ulong)((long)ppNVar16 - (long)ppNVar17) >> 3 & 0xffffffff) != uVar35;
      uVar35 = uVar35 + 1) {
    this_01 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_01);
    pcOut->mChildren[uVar35] = this_01;
    pcOut->mChildren[uVar35]->mParent = pcOut;
    AddNodeToGraph(this,pcSOut,pcOut->mChildren[uVar35],
                   (pcIn->mChildren).
                   super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar35],param_4);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&iArray.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void Discreet3DSImporter::AddNodeToGraph(aiScene* pcSOut,aiNode* pcOut,
    D3DS::Node* pcIn, aiMatrix4x4& /*absTrafo*/)
{
    std::vector<unsigned int> iArray;
    iArray.reserve(3);

    aiMatrix4x4 abs;

    // Find all meshes with the same name as the node
    for (unsigned int a = 0; a < pcSOut->mNumMeshes;++a)
    {
        const D3DS::Mesh* pcMesh = (const D3DS::Mesh*)pcSOut->mMeshes[a]->mColors[0];
        ai_assert(NULL != pcMesh);

        if (pcIn->mName == pcMesh->mName)
            iArray.push_back(a);
    }
    if (!iArray.empty())
    {
        // The matrix should be identical for all meshes with the
        // same name. It HAS to be identical for all meshes .....
        D3DS::Mesh* imesh = ((D3DS::Mesh*)pcSOut->mMeshes[iArray[0]]->mColors[0]);

        // Compute the inverse of the transformation matrix to move the
        // vertices back to their relative and local space
        aiMatrix4x4 mInv = imesh->mMat, mInvTransposed = imesh->mMat;
        mInv.Inverse();mInvTransposed.Transpose();
        aiVector3D pivot = pcIn->vPivot;

        pcOut->mNumMeshes = (unsigned int)iArray.size();
        pcOut->mMeshes = new unsigned int[iArray.size()];
        for (unsigned int i = 0;i < iArray.size();++i)  {
            const unsigned int iIndex = iArray[i];
            aiMesh* const mesh = pcSOut->mMeshes[iIndex];

            if (mesh->mColors[1] == NULL)
            {
                // Transform the vertices back into their local space
                // fixme: consider computing normals after this, so we don't need to transform them
                const aiVector3D* const pvEnd = mesh->mVertices + mesh->mNumVertices;
                aiVector3D* pvCurrent = mesh->mVertices, *t2 = mesh->mNormals;

                for (; pvCurrent != pvEnd; ++pvCurrent, ++t2) {
                    *pvCurrent = mInv * (*pvCurrent);
                    *t2 = mInvTransposed * (*t2);
                }

                // Handle negative transformation matrix determinant -> invert vertex x
                if (imesh->mMat.Determinant() < 0.0f)
                {
                    /* we *must* have normals */
                    for (pvCurrent = mesh->mVertices, t2 = mesh->mNormals; pvCurrent != pvEnd; ++pvCurrent, ++t2) {
                        pvCurrent->x *= -1.f;
                        t2->x *= -1.f;
                    }
                    ASSIMP_LOG_INFO("3DS: Flipping mesh X-Axis");
                }

                // Handle pivot point
                if (pivot.x || pivot.y || pivot.z)
                {
                    for (pvCurrent = mesh->mVertices; pvCurrent != pvEnd; ++pvCurrent)  {
                        *pvCurrent -= pivot;
                    }
                }

                mesh->mColors[1] = (aiColor4D*)1;
            }
            else
                mesh->mColors[1] = (aiColor4D*)1;

            // Setup the mesh index
            pcOut->mMeshes[i] = iIndex;
        }
    }

    // Setup the name of the node
    // First instance keeps its name otherwise something might break, all others will be postfixed with their instance number
    if (pcIn->mInstanceNumber > 1)
    {
        char tmp[12];
        ASSIMP_itoa10(tmp, pcIn->mInstanceNumber);
        std::string tempStr = pcIn->mName + "_inst_";
        tempStr += tmp;
        pcOut->mName.Set(tempStr);
    }
    else
        pcOut->mName.Set(pcIn->mName);

    // Now build the transformation matrix of the node
    // ROTATION
    if (pcIn->aRotationKeys.size()){

        // FIX to get to Assimp's quaternion conventions
        for (std::vector<aiQuatKey>::iterator it = pcIn->aRotationKeys.begin(); it != pcIn->aRotationKeys.end(); ++it) {
            (*it).mValue.w *= -1.f;
        }

        pcOut->mTransformation = aiMatrix4x4( pcIn->aRotationKeys[0].mValue.GetMatrix() );
    }
    else if (pcIn->aCameraRollKeys.size())
    {
        aiMatrix4x4::RotationZ(AI_DEG_TO_RAD(- pcIn->aCameraRollKeys[0].mValue),
            pcOut->mTransformation);
    }

    // SCALING
    aiMatrix4x4& m = pcOut->mTransformation;
    if (pcIn->aScalingKeys.size())
    {
        const aiVector3D& v = pcIn->aScalingKeys[0].mValue;
        m.a1 *= v.x; m.b1 *= v.x; m.c1 *= v.x;
        m.a2 *= v.y; m.b2 *= v.y; m.c2 *= v.y;
        m.a3 *= v.z; m.b3 *= v.z; m.c3 *= v.z;
    }

    // TRANSLATION
    if (pcIn->aPositionKeys.size())
    {
        const aiVector3D& v = pcIn->aPositionKeys[0].mValue;
        m.a4 += v.x;
        m.b4 += v.y;
        m.c4 += v.z;
    }

    // Generate animation channels for the node
    if (pcIn->aPositionKeys.size()  > 1  || pcIn->aRotationKeys.size()   > 1 ||
        pcIn->aScalingKeys.size()   > 1  || pcIn->aCameraRollKeys.size() > 1 ||
        pcIn->aTargetPositionKeys.size() > 1)
    {
        aiAnimation* anim = pcSOut->mAnimations[0];
        ai_assert(nullptr != anim);

        if (pcIn->aCameraRollKeys.size() > 1)
        {
            ASSIMP_LOG_DEBUG("3DS: Converting camera roll track ...");

            // Camera roll keys - in fact they're just rotations
            // around the camera's z axis. The angles are given
            // in degrees (and they're clockwise).
            pcIn->aRotationKeys.resize(pcIn->aCameraRollKeys.size());
            for (unsigned int i = 0; i < pcIn->aCameraRollKeys.size();++i)
            {
                aiQuatKey&  q = pcIn->aRotationKeys[i];
                aiFloatKey& f = pcIn->aCameraRollKeys[i];

                q.mTime  = f.mTime;

                // FIX to get to Assimp quaternion conventions
                q.mValue = aiQuaternion(0.f,0.f,AI_DEG_TO_RAD( /*-*/ f.mValue));
            }
        }
#if 0
        if (pcIn->aTargetPositionKeys.size() > 1)
        {
            ASSIMP_LOG_DEBUG("3DS: Converting target track ...");

            // Camera or spot light - need to convert the separate
            // target position channel to our representation
            TargetAnimationHelper helper;

            if (pcIn->aPositionKeys.empty())
            {
                // We can just pass zero here ...
                helper.SetFixedMainAnimationChannel(aiVector3D());
            }
            else  helper.SetMainAnimationChannel(&pcIn->aPositionKeys);
            helper.SetTargetAnimationChannel(&pcIn->aTargetPositionKeys);

            // Do the conversion
            std::vector<aiVectorKey> distanceTrack;
            helper.Process(&distanceTrack);

            // Now add a new node as child, name it <ourName>.Target
            // and assign the distance track to it. This is that the
            // information where the target is and how it moves is
            // not lost
            D3DS::Node* nd = new D3DS::Node();
            pcIn->push_back(nd);

            nd->mName = pcIn->mName + ".Target";

            aiNodeAnim* nda = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
            nda->mNodeName.Set(nd->mName);

            nda->mNumPositionKeys = (unsigned int)distanceTrack.size();
            nda->mPositionKeys = new aiVectorKey[nda->mNumPositionKeys];
            ::memcpy(nda->mPositionKeys,&distanceTrack[0],
                sizeof(aiVectorKey)*nda->mNumPositionKeys);
        }
#endif

        // Cameras or lights define their transformation in their parent node and in the
        // corresponding light or camera chunks. However, we read and process the latter
        // to to be able to return valid cameras/lights even if no scenegraph is given.
        for (unsigned int n = 0; n < pcSOut->mNumCameras;++n)   {
            if (pcSOut->mCameras[n]->mName == pcOut->mName) {
                pcSOut->mCameras[n]->mLookAt = aiVector3D(0.f,0.f,1.f);
            }
        }
        for (unsigned int n = 0; n < pcSOut->mNumLights;++n)    {
            if (pcSOut->mLights[n]->mName == pcOut->mName) {
                pcSOut->mLights[n]->mDirection = aiVector3D(0.f,0.f,1.f);
            }
        }

        // Allocate a new node anim and setup its name
        aiNodeAnim* nda = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
        nda->mNodeName.Set(pcIn->mName);

        // POSITION keys
        if (pcIn->aPositionKeys.size()  > 0)
        {
            nda->mNumPositionKeys = (unsigned int)pcIn->aPositionKeys.size();
            nda->mPositionKeys = new aiVectorKey[nda->mNumPositionKeys];
            ::memcpy(nda->mPositionKeys,&pcIn->aPositionKeys[0],
                sizeof(aiVectorKey)*nda->mNumPositionKeys);
        }

        // ROTATION keys
        if (pcIn->aRotationKeys.size()  > 0)
        {
            nda->mNumRotationKeys = (unsigned int)pcIn->aRotationKeys.size();
            nda->mRotationKeys = new aiQuatKey[nda->mNumRotationKeys];

            // Rotations are quaternion offsets
            aiQuaternion abs1;
            for (unsigned int n = 0; n < nda->mNumRotationKeys;++n)
            {
                const aiQuatKey& q = pcIn->aRotationKeys[n];

                abs1 = (n ? abs1 * q.mValue : q.mValue);
                nda->mRotationKeys[n].mTime  = q.mTime;
                nda->mRotationKeys[n].mValue = abs1.Normalize();
            }
        }

        // SCALING keys
        if (pcIn->aScalingKeys.size()  > 0)
        {
            nda->mNumScalingKeys = (unsigned int)pcIn->aScalingKeys.size();
            nda->mScalingKeys = new aiVectorKey[nda->mNumScalingKeys];
            ::memcpy(nda->mScalingKeys,&pcIn->aScalingKeys[0],
                sizeof(aiVectorKey)*nda->mNumScalingKeys);
        }
    }

    // Allocate storage for children
    pcOut->mNumChildren = (unsigned int)pcIn->mChildren.size();
    pcOut->mChildren = new aiNode*[pcIn->mChildren.size()];

    // Recursively process all children
    const unsigned int size = static_cast<unsigned int>(pcIn->mChildren.size());
    for (unsigned int i = 0; i < size;++i)
    {
        pcOut->mChildren[i] = new aiNode();
        pcOut->mChildren[i]->mParent = pcOut;
        AddNodeToGraph(pcSOut,pcOut->mChildren[i],pcIn->mChildren[i],abs);
    }
}